

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O3

_Bool borg_think_home_buy_useful(void)

{
  uint8_t *puVar1;
  int16_t *piVar2;
  short sVar3;
  short sVar4;
  _Bool _Var5;
  ushort uVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  int iVar10;
  char *what;
  bool bVar11;
  ulong uVar12;
  uint8_t uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  borg_item *item;
  bool bVar17;
  borg_item_conflict *pbVar18;
  int32_t local_74;
  uint local_70;
  int local_60;
  int local_5c;
  int local_4c;
  
  _Var5 = false;
  if (z_info->store_inven_max != 0) {
    local_74 = borg.power;
    local_5c = -1;
    uVar15 = 0;
    bVar11 = false;
    local_60 = 0;
    local_4c = 0;
    local_70 = 0;
    do {
      if (borg_shops[7].ware[uVar15].iqty != '\0') {
        item = (borg_item *)(borg_shops[7].ware + uVar15);
        if (L'\0' < sold_item_num) {
          lVar14 = 0;
          bVar17 = false;
          wVar7 = sold_item_num;
          do {
            if (((sold_item_tval[lVar14] == (uint)item->tval) &&
                (sold_item_sval[lVar14] == (uint)item->sval)) && (bVar17 = true, *borg_cfg != 0)) {
              what = format("# Choosing not to buy back \'%s\' from home.",item);
              borg_note(what);
              wVar7 = sold_item_num;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 < wVar7);
          if (bVar17) goto LAB_00241d28;
        }
        wVar7 = borg_first_empty_inventory_slot();
        if (wVar7 != L'\xffffffff') {
          if ((item->tval & 0xfe) == 0x16) {
            local_70 = (int)item->pval / (int)(short)(ushort)item->iqty & 0xffff;
          }
          wVar8 = borg_min_item_quantity((borg_item_conflict *)item);
          pbVar18 = borg_shops[7].ware;
          puVar1 = &pbVar18[uVar15].iqty;
          uVar13 = (uint8_t)wVar8;
          *puVar1 = *puVar1 - uVar13;
          sVar3 = (short)wVar8;
          sVar4 = (short)local_70;
          if ((item->tval & 0xfe) == 0x16) {
            piVar2 = &pbVar18[uVar15].pval;
            *piVar2 = *piVar2 - sVar3 * sVar4;
          }
          wVar8 = borg_wield_slot(item);
          uVar12 = (ulong)(uint)wVar8;
          wVar9 = borg_slot((uint)item->tval,(uint)item->sval);
          if (wVar8 < L'\0') {
            if (local_74 < 0) {
              iVar10 = 0;
            }
            else {
LAB_00241bb7:
              wVar8 = wVar9;
              if ((wVar9 == L'\xffffffff') &&
                 (wVar8 = wVar7,
                 (int)((uint)z_info->pack_size - borg.trait[0x9e]) <= wVar7 + L'\x01'))
              goto LAB_00241d28;
              wVar7 = wVar8;
              memcpy(borg_items + wVar7,borg_safe_shops[7].ware + uVar15,0x388);
              pbVar18 = borg_items;
              if (wVar9 == L'\xffffffff') {
                borg_items[wVar7].iqty = uVar13;
                if ((item->tval & 0xfe) == 0x16) {
                  pbVar18[wVar7].pval = sVar3 * sVar4;
                }
              }
              else {
                borg_items[wVar7].iqty = safe_items[wVar7].iqty + uVar13;
                if ((item->tval & 0xfe) == 0x16) {
                  piVar2 = &pbVar18[wVar7].pval;
                  *piVar2 = *piVar2 + sVar3 * sVar4;
                }
              }
              borg_notice(true);
              bVar11 = true;
              iVar10 = borg_power();
            }
          }
          else {
            uVar6 = z_info->pack_size;
            if ((int)((uint)uVar6 - borg.trait[0x9e]) <= wVar7 + L'\x01') goto LAB_00241d28;
            uVar16 = (ulong)wVar7;
            if (wVar8 == (uint)uVar6 + L'\x03') {
              if (borg_items[uVar12].one_ring == false) {
                memcpy(borg_items + uVar16,safe_items + uVar12,0x388);
                memcpy(borg_items + uVar12,borg_safe_shops[7].ware + uVar15,0x388);
                borg_items[uVar12].iqty = '\x01';
                borg_notice(true);
                local_4c = borg_power();
                memcpy(borg_items + uVar12,safe_items + uVar12,0x388);
                uVar6 = z_info->pack_size;
                bVar11 = true;
              }
              if (borg_items[(ulong)uVar6 + 2].one_ring == false) {
                memcpy(borg_items + uVar16,safe_items + (ulong)uVar6 + 2,0x388);
                memcpy(borg_items + (ulong)z_info->pack_size + 2,borg_safe_shops[7].ware + uVar15,
                       0x388);
                borg_items[(ulong)z_info->pack_size + 2].iqty = uVar13;
                borg_notice(true);
                local_60 = borg_power();
                memcpy(borg_items + (ulong)z_info->pack_size + 2,
                       safe_items + (ulong)z_info->pack_size + 2,0x388);
                bVar11 = true;
              }
              iVar10 = local_4c;
              if (local_4c < local_60) {
                iVar10 = local_60;
              }
              pbVar18 = borg_items + uVar16;
              uVar12 = uVar16;
            }
            else {
              memcpy(borg_items + uVar16,safe_items + uVar12,0x388);
              memcpy(borg_items + uVar12,borg_safe_shops[7].ware + uVar15,0x388);
              borg_items[uVar12].iqty = uVar13;
              borg_notice(true);
              iVar10 = borg_power();
              pbVar18 = borg_items + uVar12;
              bVar11 = true;
            }
            memcpy(pbVar18,safe_items + uVar12,0x388);
            if (iVar10 <= local_74) {
              borg_items[uVar16].iqty = '\0';
              goto LAB_00241bb7;
            }
          }
          memcpy(borg_items + wVar7,safe_items + wVar7,0x388);
          memcpy(borg_shops[7].ware + uVar15,borg_safe_shops[7].ware + uVar15,0x388);
          if (local_74 < iVar10) {
            local_5c = (int)uVar15;
            local_74 = iVar10;
          }
        }
      }
LAB_00241d28:
      uVar15 = uVar15 + 1;
    } while (uVar15 < z_info->store_inven_max);
    if (bVar11) {
      borg_notice(true);
    }
    _Var5 = false;
    if ((-1 < local_5c) && (_Var5 = false, borg.power < local_74)) {
      borg.goal.shop = 7;
      borg.goal.ware = (int16_t)local_5c;
      _Var5 = true;
    }
  }
  return _Var5;
}

Assistant:

bool borg_think_home_buy_useful(void)
{

    int     hole;
    int     slot, i;
    int     stack;
    int     qty = 1;
    int     n, b_n = -1;
    int     charge_each = 0;
    int32_t p, b_p = 0L;
    int32_t p_left  = 0;
    int32_t p_right = 0;

    bool fix        = false;
    bool skip_it    = false;

    /* Extract the "power" */
    b_p = borg.power;

    /* Scan the home */
    for (n = 0; n < z_info->store_inven_max; n++) {
        borg_item *item = &borg_shops[BORG_HOME].ware[n];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Skip it if I just sold it */
        skip_it = false;
        for (i = 0; i < sold_item_num; i++) {
            if (sold_item_tval[i] == item->tval
                && sold_item_sval[i] == item->sval) {
                if (borg_cfg[BORG_VERBOSE])
                    borg_note(
                        format("# Choosing not to buy back '%s' from home.",
                            item->desc));
                skip_it = true;
            }
        }
        if (skip_it == true)
            continue;

        /* Reset the 'hole' in case it was changed by the last stacked item.*/
        hole = borg_first_empty_inventory_slot();
        if (hole == -1)
            continue;

        /* borg_note(format("# Considering buying (%d)'%s' (pval=%d) from
         * home.", item->iqty,item->desc, item->pval)); */

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            charge_each = item->pval / item->iqty;

        /* Save the number */
        qty = borg_min_item_quantity(item);

        /* Remove one item from shop (sometimes) */
        borg_shops[BORG_HOME].ware[n].iqty -= qty;

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            borg_shops[BORG_HOME].ware[n].pval -= (qty * charge_each);

        /* Obtain "slot" */
        slot  = borg_wield_slot(item);
        stack = borg_slot(item->tval, item->sval);

        /* Consider new equipment-- Must check both ring slots */
        p = 0;
        if (slot >= 0) {
            /* Require two empty slots */
            if (hole == -1)
                continue;
            if ((hole + 1) >= PACK_SLOTS)
                continue;

            /* Check Rings */
            if (slot == INVEN_LEFT) {
                /** First Check Left Hand **/

                /* special curse check for left ring */
                if (!borg_items[INVEN_LEFT].one_ring) {
                    /* Move equipment into inventory */
                    memcpy(&borg_items[hole], &safe_items[slot],
                        sizeof(borg_item));

                    /* Move new item into equipment */
                    memcpy(&borg_items[slot],
                        &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

                    /* Only a single item */
                    borg_items[slot].iqty = 1;

                    /* Fix later */
                    fix = true;

                    /* Examine the inventory */
                    borg_notice(true);

                    /* Evaluate the inventory */
                    p_left = borg_power();
#if 0
                    /* dump list and power...  for debugging */
                    borg_note(format("Trying Item %s (best power %ld)", borg_items[slot].desc, p_left));
                    borg_note(format("   Against Item %s   (borg_power %ld)", safe_items[slot].desc, borg.power));
#endif
                    /* Restore old item */
                    memcpy(&borg_items[slot], &safe_items[slot],
                        sizeof(borg_item));
                }

                /** Second Check Right Hand **/
                /* special curse check for right ring */
                if (!borg_items[INVEN_RIGHT].one_ring) {
                    /* Move equipment into inventory */
                    memcpy(&borg_items[hole], &safe_items[INVEN_RIGHT],
                        sizeof(borg_item));

                    /* Move new item into equipment */
                    memcpy(&borg_items[INVEN_RIGHT],
                        &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

                    /* Only a single item */
                    borg_items[INVEN_RIGHT].iqty = qty;

                    /* Fix later */
                    fix = true;

                    /* Examine the inventory */
                    borg_notice(true);

                    /* Evaluate the inventory */
                    p_right = borg_power();

#if 0
                    /* dump list and power...  for debugging */
                    borg_note(format("Trying Item %s (best power %ld)", borg_items[INVEN_RIGHT].desc, p_right));
                    borg_note(format("   Against Item %s   (borg_power %ld)", safe_items[INVEN_RIGHT].desc, borg.power));
#endif
                    /* Restore old item */
                    memcpy(&borg_items[INVEN_RIGHT], &safe_items[INVEN_RIGHT],
                        sizeof(borg_item));
                }

                /* Is this ring better than one of mine? */
                p = MAX(p_right, p_left);

                /* Restore hole */
                memcpy(&borg_items[hole], &safe_items[hole], sizeof(borg_item));
            }

            else /* non rings */
            {
                /* Move equipment into inventory */
                memcpy(&borg_items[hole], &safe_items[slot], sizeof(borg_item));

                /* Move new item into equipment */
                memcpy(&borg_items[slot], &borg_safe_shops[BORG_HOME].ware[n],
                    sizeof(borg_item));

                /* Only a single item */
                borg_items[slot].iqty = qty;

                /* Fix later */
                fix = true;

                /* Examine the inventory */
                borg_notice(true);

                /* Evaluate the inventory */
                p = borg_power();
#if 0
                /* dump list and power...  for debugging */
                borg_note(format("Trying Item %s (best power %ld)", borg_items[slot].desc, p));
                borg_note(format("   Against Item %s   (borg_power %ld)", safe_items[slot].desc, borg.power));
#endif
                /* Restore old item */
                memcpy(&borg_items[slot], &safe_items[slot], sizeof(borg_item));
            } /* non rings */
        } /* equip */

        /* Consider new inventory.*/
        /* note, we may grab an equip able if, for example, we want to ID it */
        if (p <= b_p) {
            /* Restore hole if we are trying an item in inventory that didn't
             * work equipped */
            if (slot >= 0)
                borg_items[hole].iqty = 0;

            if (stack != -1)
                hole = stack;

            /* Require two empty slots */
            if (stack == -1 && hole == -1)
                continue;
            if (stack == -1 && (hole + 1) >= PACK_SLOTS)
                continue;

            /* Move new item into inventory */
            memcpy(&borg_items[hole], &borg_safe_shops[BORG_HOME].ware[n],
                sizeof(borg_item));

            /* Is this new item merging into an existing stack? */
            if (stack != -1) {
                /* Add a quantity to the stack */
                borg_items[hole].iqty = safe_items[hole].iqty + qty;

                /* for wands and staffs adjust charges */
                if (item->tval == TV_STAFF || item->tval == TV_WAND)
                    borg_items[hole].pval += (qty * charge_each);

            } else {
                /* Only a single item */
                borg_items[hole].iqty = qty;

                /* for wands and staffs adjust charges */
                if (item->tval == TV_STAFF || item->tval == TV_WAND)
                    borg_items[hole].pval = (qty * charge_each);
            }

            /* Fix later */
            fix = true;

            /* Examine the inventory */
            borg_notice(true);

            /* Evaluate the equipment */
            p = borg_power();
        }

        /* Restore hole */
        memcpy(&borg_items[hole], &safe_items[hole], sizeof(borg_item));

        /* Restore shop item */
        memcpy(&borg_shops[BORG_HOME].ware[n],
            &borg_safe_shops[BORG_HOME].ware[n], sizeof(borg_item));

        /* Ignore "silly" purchases */
        if (p <= b_p)
            continue;

        /* Save the item and cost */
        b_n = n;
        b_p = p;
    }

    /* Examine the inventory */
    if (fix)
        borg_notice(true);

    /* Buy something */
    if ((b_n >= 0) && (b_p > borg.power)) {
        /* Go to the home */
        borg.goal.shop = BORG_HOME;

        /* Buy that item */
        borg.goal.ware = b_n;

        /* Success */
        return true;
    }

    /* Nope */
    return false;
}